

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_preserve_env(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  undefined8 uVar3;
  uv_stdio_container_t stdio [2];
  uv_pipe_t out;
  uv_stdio_container_t local_138;
  undefined4 local_128;
  undefined1 *local_120;
  undefined1 local_110 [264];
  
  init_process_options("spawn_helper7",exit_cb);
  uVar3 = uv_default_loop();
  uv_pipe_init(uVar3,local_110,0);
  local_138.flags = UV_IGNORE;
  local_128 = 0x21;
  options.stdio_count = 2;
  options.stdio = &local_138;
  local_120 = local_110;
  iVar1 = putenv("ENV_TEST=testval");
  if (iVar1 == 0) {
    options.env = (char **)0x0;
    uVar3 = uv_default_loop();
    iVar1 = uv_spawn(uVar3,&process,&options);
    if (iVar1 != 0) goto LAB_0017a88d;
    iVar1 = uv_read_start(local_110,on_alloc,on_read);
    if (iVar1 != 0) goto LAB_0017a892;
    uVar3 = uv_default_loop();
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) goto LAB_0017a897;
    if (exit_cb_called != 1) goto LAB_0017a89c;
    if (close_cb_called != 2) goto LAB_0017a8a1;
    printf("output is: %s",output);
    if (output._0_8_ != 0x6c617674736574) goto LAB_0017a8a6;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    uv_run(uVar3,0);
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_preserve_env_cold_1();
LAB_0017a88d:
    run_test_spawn_preserve_env_cold_2();
LAB_0017a892:
    run_test_spawn_preserve_env_cold_3();
LAB_0017a897:
    run_test_spawn_preserve_env_cold_4();
LAB_0017a89c:
    run_test_spawn_preserve_env_cold_5();
LAB_0017a8a1:
    run_test_spawn_preserve_env_cold_6();
LAB_0017a8a6:
    run_test_spawn_preserve_env_cold_7();
  }
  run_test_spawn_preserve_env_cold_8();
  init_process_options("spawn_helper4",detach_failure_cb);
  options.flags._0_1_ = (byte)options.flags | 8;
  uVar3 = uv_default_loop();
  iVar1 = uv_spawn(uVar3,&process,&options);
  if (iVar1 == 0) {
    uv_unref(&process);
    uVar3 = uv_default_loop();
    iVar2 = uv_run(uVar3,0);
    iVar1 = process.pid;
    if (iVar2 != 0) goto LAB_0017a99e;
    if (exit_cb_called != 0) goto LAB_0017a9a3;
    iVar2 = uv_process_get_pid(&process);
    if (iVar1 != iVar2) goto LAB_0017a9a8;
    iVar1 = uv_kill(process.pid,0);
    if (iVar1 != 0) goto LAB_0017a9ad;
    iVar1 = uv_kill(process.pid,0xf);
    if (iVar1 == 0) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0017a9b7;
    }
  }
  else {
    run_test_spawn_detached_cold_1();
LAB_0017a99e:
    run_test_spawn_detached_cold_2();
LAB_0017a9a3:
    run_test_spawn_detached_cold_3();
LAB_0017a9a8:
    run_test_spawn_detached_cold_4();
LAB_0017a9ad:
    run_test_spawn_detached_cold_5();
  }
  run_test_spawn_detached_cold_6();
LAB_0017a9b7:
  run_test_spawn_detached_cold_7();
  puts("detach_cb");
  exit_cb_called = exit_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_preserve_env) {
  int r;
  uv_pipe_t out;
  uv_stdio_container_t stdio[2];

  init_process_options("spawn_helper7", exit_cb);

  uv_pipe_init(uv_default_loop(), &out, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio_count = 2;

  r = putenv("ENV_TEST=testval");
  ASSERT(r == 0);

  /* Explicitly set options.env to NULL to test for env clobbering. */
  options.env = NULL;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 2);

  printf("output is: %s", output);
  ASSERT(strcmp("testval", output) == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}